

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O3

int __thiscall cnn::GRUBuilder::copy(GRUBuilder *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  pointer pvVar1;
  pointer pvVar2;
  EVP_PKEY_CTX *src_00;
  ulong uVar3;
  ulong uVar4;
  
  pvVar1 = (this->params).
           super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->params).
           super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((long)pvVar2 - (long)pvVar1 == *(long *)(dst + 0x30) - *(long *)(dst + 0x28)) {
    if (pvVar2 != pvVar1) {
      uVar4 = 0;
      do {
        src_00 = (EVP_PKEY_CTX *)
                 pvVar1[uVar4].
                 super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((EVP_PKEY_CTX *)
            pvVar1[uVar4].super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
            _M_impl.super__Vector_impl_data._M_finish != src_00) {
          uVar3 = 0;
          do {
            Parameters::copy(*(Parameters **)(src_00 + uVar3 * 8),
                             *(EVP_PKEY_CTX **)
                              (*(long *)(*(long *)(dst + 0x28) + uVar4 * 0x18) + uVar3 * 8),src_00);
            uVar3 = uVar3 + 1;
            pvVar1 = (this->params).
                     super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            src_00 = (EVP_PKEY_CTX *)
                     pvVar1[uVar4].
                     super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          } while (uVar3 < (ulong)((long)pvVar1[uVar4].
                                         super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)src_00
                                  >> 3));
          pvVar2 = (this->params).
                   super__Vector_base<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>,_std::allocator<std::vector<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)(((long)pvVar2 - (long)pvVar1 >> 3) * -0x5555555555555555));
    }
    return (int)pvVar1;
  }
  __assert_fail("params.size() == rnn_gru.params.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/clab[P]att-coref/cnn/cnn/gru.cc"
                ,0x80,"virtual void cnn::GRUBuilder::copy(const RNNBuilder &)");
}

Assistant:

void GRUBuilder::copy(const RNNBuilder & rnn) {
  const GRUBuilder & rnn_gru = (const GRUBuilder&)rnn;
  assert(params.size() == rnn_gru.params.size());
  for(size_t i = 0; i < params.size(); ++i)
      for(size_t j = 0; j < params[i].size(); ++j)
        params[i][j]->copy(*rnn_gru.params[i][j]);
}